

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeSetMaxStep(void *cvode_mem,sunrealtype hmax)

{
  CVodeMem in_RDI;
  double in_XMM0_Qa;
  CVodeMem cv_mem;
  sunrealtype hmax_inv;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x160,"CVodeSetMaxStep",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      if ((1.0 / in_XMM0_Qa) * in_RDI->cv_hmin <= 1.0) {
        in_RDI->cv_hmax_inv = 1.0 / in_XMM0_Qa;
        local_4 = 0;
      }
      else {
        cvProcessError(in_RDI,-0x16,0x177,"CVodeSetMaxStep",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                       ,"Inconsistent step size limits: hmin > hmax.");
        local_4 = -0x16;
      }
    }
    else {
      in_RDI->cv_hmax_inv = 0.0;
      local_4 = 0;
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,0x168,"CVodeSetMaxStep",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                   ,"hmax < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSetMaxStep(void* cvode_mem, sunrealtype hmax)
{
  sunrealtype hmax_inv;
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (hmax < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NEG_HMAX);
    return (CV_ILL_INPUT);
  }

  /* Passing 0 sets hmax = infinity */
  if (hmax == ZERO)
  {
    cv_mem->cv_hmax_inv = HMAX_INV_DEFAULT;
    return (CV_SUCCESS);
  }

  hmax_inv = ONE / hmax;
  if (hmax_inv * cv_mem->cv_hmin > ONE)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_HMIN_HMAX);
    return (CV_ILL_INPUT);
  }

  cv_mem->cv_hmax_inv = hmax_inv;

  return (CV_SUCCESS);
}